

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

LBBox3fa * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
::vlinearBounds(LBBox3fa *__return_storage_ptr__,
               CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
               *this,size_t primID,BBox1f *time_range)

{
  uint uVar1;
  int iVar2;
  size_t itime;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar9 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  anon_class_16_2_07cfa4d6 local_118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  size_t local_a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_118.primID = &local_a0;
  fVar14 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
           super_Geometry.fnumTimeSegments;
  fVar17 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
           super_Geometry.time_range.lower;
  fVar7 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper - fVar17;
  fVar13 = (time_range->lower - fVar17) / fVar7;
  fVar7 = (time_range->upper - fVar17) / fVar7;
  fVar3 = fVar14 * fVar13;
  fVar16 = fVar14 * fVar7;
  local_118.this = this;
  local_a0 = primID;
  fVar4 = floorf(fVar3);
  fVar5 = ceilf(fVar16);
  fVar17 = fVar4;
  if (fVar4 <= 0.0) {
    fVar17 = 0.0;
  }
  fVar15 = fVar5;
  if (fVar14 <= fVar5) {
    fVar15 = fVar14;
  }
  uVar1 = 0xffffffff;
  if (-1 < (int)fVar4) {
    uVar1 = (int)fVar4;
  }
  iVar2 = (int)fVar14 + 1;
  if ((int)fVar5 < (int)fVar14 + 1) {
    iVar2 = (int)fVar5;
  }
  linearBounds::anon_class_16_2_07cfa4d6::operator()
            ((BBox3fa *)&local_e8.field_1,&local_118,(long)(int)fVar17);
  linearBounds::anon_class_16_2_07cfa4d6::operator()
            ((BBox3fa *)&local_108.field_1,&local_118,(long)(int)fVar15);
  if (iVar2 - uVar1 == 1) {
    fVar3 = fVar3 - fVar17;
    if (fVar3 <= 0.0) {
      fVar3 = 0.0;
    }
    fVar14 = 1.0 - fVar3;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] =
         fVar14 * local_e8.m128[0] + fVar3 * local_108.m128[0];
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] =
         fVar14 * local_e8.m128[1] + fVar3 * local_108.m128[1];
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] =
         fVar14 * local_e8.m128[2] + fVar3 * local_108.m128[2];
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] =
         fVar14 * local_e8.m128[3] + fVar3 * local_108.m128[3];
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar14 * local_d8 + fVar3 * local_f8;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar14 * fStack_d4 + fVar3 * fStack_f4
    ;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar14 * fStack_d0 + fVar3 * fStack_f0
    ;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar14 * fStack_cc + fVar3 * fStack_ec
    ;
    fVar15 = fVar15 - fVar16;
    if (fVar15 <= 0.0) {
      fVar15 = 0.0;
    }
    fVar14 = 1.0 - fVar15;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[0] =
         local_108.m128[0] * fVar14 + local_e8.m128[0] * fVar15;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[1] =
         local_108.m128[1] * fVar14 + local_e8.m128[1] * fVar15;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[2] =
         local_108.m128[2] * fVar14 + local_e8.m128[2] * fVar15;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[3] =
         local_108.m128[3] * fVar14 + local_e8.m128[3] * fVar15;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar14 * local_f8 + fVar15 * local_d8;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[1] =
         fVar14 * fStack_f4 + fVar15 * fStack_d4;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[2] =
         fVar14 * fStack_f0 + fVar15 * fStack_d0;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[3] =
         fVar14 * fStack_ec + fVar15 * fStack_cc;
  }
  else {
    linearBounds::anon_class_16_2_07cfa4d6::operator()
              ((BBox3fa *)&local_58.field_1,&local_118,(long)((int)fVar17 + 1));
    linearBounds::anon_class_16_2_07cfa4d6::operator()
              ((BBox3fa *)&local_78.field_1,&local_118,(long)((int)fVar15 + -1));
    fVar3 = fVar3 - fVar17;
    if (fVar3 <= 0.0) {
      fVar3 = 0.0;
    }
    fVar17 = 1.0 - fVar3;
    fVar19 = local_e8.m128[0] * fVar17 + local_58.m128[0] * fVar3;
    fVar20 = local_e8.m128[1] * fVar17 + local_58.m128[1] * fVar3;
    fVar21 = local_e8.m128[2] * fVar17 + local_58.m128[2] * fVar3;
    fVar22 = local_e8.m128[3] * fVar17 + local_58.m128[3] * fVar3;
    fVar4 = fVar17 * local_d8 + fVar3 * local_48;
    fVar5 = fVar17 * fStack_d4 + fVar3 * fStack_44;
    fVar18 = fVar17 * fStack_d0 + fVar3 * fStack_40;
    fVar17 = fVar17 * fStack_cc + fVar3 * fStack_3c;
    fVar15 = fVar15 - fVar16;
    if (fVar15 <= 0.0) {
      fVar15 = 0.0;
    }
    fVar24 = 1.0 - fVar15;
    local_c8 = local_108.m128[0] * fVar24 + local_78.m128[0] * fVar15;
    fStack_c4 = local_108.m128[1] * fVar24 + local_78.m128[1] * fVar15;
    fStack_c0 = local_108.m128[2] * fVar24 + local_78.m128[2] * fVar15;
    fStack_bc = local_108.m128[3] * fVar24 + local_78.m128[3] * fVar15;
    fVar3 = fVar24 * local_f8 + fVar15 * local_68;
    fVar16 = fVar24 * fStack_f4 + fVar15 * fStack_64;
    fVar25 = fVar24 * fStack_f0 + fVar15 * fStack_60;
    fVar15 = fVar24 * fStack_ec + fVar15 * fStack_5c;
    if ((int)(uVar1 + 1) < iVar2) {
      itime = (size_t)(uVar1 + 1);
      iVar2 = ~uVar1 + iVar2;
      do {
        fVar24 = ((float)(int)itime / fVar14 - fVar13) / (fVar7 - fVar13);
        fVar23 = 1.0 - fVar24;
        fVar8 = local_c8 * fVar24;
        fVar10 = fStack_c4 * fVar24;
        fVar11 = fStack_c0 * fVar24;
        fVar12 = fStack_bc * fVar24;
        local_b8 = fVar23 * fVar4 + fVar24 * fVar3;
        fStack_b4 = fVar23 * fVar5 + fVar24 * fVar16;
        fStack_b0 = fVar23 * fVar18 + fVar24 * fVar25;
        fStack_ac = fVar23 * fVar17 + fVar24 * fVar15;
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_98.field_1,&local_118,itime);
        auVar6._0_4_ = local_98.m128[0] - (fVar19 * fVar23 + fVar8);
        auVar6._4_4_ = local_98.m128[1] - (fVar20 * fVar23 + fVar10);
        auVar6._8_4_ = local_98.m128[2] - (fVar21 * fVar23 + fVar11);
        auVar6._12_4_ = local_98.m128[3] - (fVar22 * fVar23 + fVar12);
        auVar9._0_4_ = local_88 - local_b8;
        auVar9._4_4_ = fStack_84 - fStack_b4;
        auVar9._8_4_ = fStack_80 - fStack_b0;
        auVar9._12_4_ = fStack_7c - fStack_ac;
        auVar6 = minps(auVar6,ZEXT816(0));
        auVar9 = maxps(auVar9,ZEXT816(0));
        fVar19 = fVar19 + auVar6._0_4_;
        fVar20 = fVar20 + auVar6._4_4_;
        fVar21 = fVar21 + auVar6._8_4_;
        fVar22 = fVar22 + auVar6._12_4_;
        local_c8 = auVar6._0_4_ + local_c8;
        fStack_c4 = auVar6._4_4_ + fStack_c4;
        fStack_c0 = auVar6._8_4_ + fStack_c0;
        fStack_bc = auVar6._12_4_ + fStack_bc;
        fVar4 = fVar4 + auVar9._0_4_;
        fVar5 = fVar5 + auVar9._4_4_;
        fVar18 = fVar18 + auVar9._8_4_;
        fVar17 = fVar17 + auVar9._12_4_;
        fVar3 = auVar9._0_4_ + fVar3;
        fVar16 = auVar9._4_4_ + fVar16;
        fVar25 = auVar9._8_4_ + fVar25;
        fVar15 = auVar9._12_4_ + fVar15;
        itime = itime + 1;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar19;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar20;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar21;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar22;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar4;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar5;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar18;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar17;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[0] = local_c8;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[1] = fStack_c4;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[2] = fStack_c0;
    (__return_storage_ptr__->bounds1).lower.field_0.m128[3] = fStack_bc;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar3;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[1] = fVar16;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[2] = fVar25;
    (__return_storage_ptr__->bounds1).upper.field_0.m128[3] = fVar15;
  }
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t primID, const BBox1f& time_range) const {
        return linearBounds(primID,time_range);
      }